

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O3

Vec_Int_t *
Vta_ManUnsatCore(int iLit,sat_solver2 *pSat,int nConfMax,int fVerbose,int *piRetValue,int *pnConfls)

{
  ABC_INT64_T AVar1;
  int iVar2;
  int *piVar3;
  Vec_Int_t *p;
  timespec ts;
  int local_44;
  timespec local_40;
  
  local_44 = iLit;
  clock_gettime(3,&local_40);
  AVar1 = (pSat->stats).conflicts;
  if (piRetValue != (int *)0x0) {
    *piRetValue = 1;
  }
  if (iLit < 0) {
    p = (Vec_Int_t *)malloc(0x10);
    p->nCap = 0x10;
    p->nSize = 0;
    piVar3 = (int *)malloc(0x40);
    p->pArray = piVar3;
    Vec_IntPush(p,-iLit);
  }
  else {
    iVar2 = sat_solver2_solve(pSat,&local_44,(lit *)&local_40,(long)nConfMax,0,0,0);
    if (pnConfls != (int *)0x0) {
      *pnConfls = (int)(pSat->stats).conflicts - (int)AVar1;
    }
    if (iVar2 == -1) {
      clock_gettime(3,&local_40);
      p = (Vec_Int_t *)Sat_ProofCore(pSat);
    }
    else {
      if (iVar2 == 1) {
        if (piRetValue != (int *)0x0) {
          *piRetValue = 0;
        }
      }
      else {
        if (iVar2 != 0) {
          __assert_fail("RetValue == l_False",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                        ,0x460,
                        "Vec_Int_t *Vta_ManUnsatCore(int, sat_solver2 *, int, int, int *, int *)");
        }
        if (piRetValue != (int *)0x0) {
          *piRetValue = -1;
        }
      }
      p = (Vec_Int_t *)0x0;
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Vta_ManUnsatCore( int iLit, sat_solver2 * pSat, int nConfMax, int fVerbose, int * piRetValue, int * pnConfls )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vCore;
    int RetValue, nConfPrev = pSat->stats.conflicts;
    if ( piRetValue )
        *piRetValue = 1;
    // consider special case when PO points to the flop
    // this leads to immediate conflict in the first timeframe
    if ( iLit < 0 )
    {
        vCore = Vec_IntAlloc( 1 );
        Vec_IntPush( vCore, -iLit );
        return vCore;
    }
    // solve the problem
    RetValue = sat_solver2_solve( pSat, &iLit, &iLit+1, (ABC_INT64_T)nConfMax, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( pnConfls )
        *pnConfls = (int)pSat->stats.conflicts - nConfPrev;
    if ( RetValue == l_Undef )
    {
        if ( piRetValue )
            *piRetValue = -1;
        return NULL;
    }
    if ( RetValue == l_True )
    {
        if ( piRetValue )
            *piRetValue = 0;
        return NULL;
    }
    if ( fVerbose )
    {
//        Abc_Print( 1, "%6d", (int)pSat->stats.conflicts - nConfPrev );
//        Abc_Print( 1, "UNSAT after %7d conflicts.      ", pSat->stats.conflicts );
//        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    assert( RetValue == l_False );
    // derive the UNSAT core
    clk = Abc_Clock();
    vCore = (Vec_Int_t *)Sat_ProofCore( pSat );
    if ( fVerbose )
    {
//        Abc_Print( 1, "Core is %8d vars    (out of %8d).   ", Vec_IntSize(vCore), sat_solver2_nvars(pSat) );
//        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    return vCore;
}